

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O0

void __thiscall v_array<feature_slice>::delete_v(v_array<feature_slice> *this)

{
  long *in_RDI;
  feature_slice *item;
  long local_10;
  
  if (*in_RDI != 0) {
    for (local_10 = *in_RDI; local_10 != in_RDI[1]; local_10 = local_10 + 0x50) {
      feature_slice::~feature_slice((feature_slice *)0x2563bd);
    }
    free((void *)*in_RDI);
  }
  in_RDI[2] = 0;
  in_RDI[1] = 0;
  *in_RDI = 0;
  return;
}

Assistant:

void delete_v()
  {
    if (_begin != nullptr)
    {
      for (T* item = _begin; item != _end; ++item) item->~T();
      free(_begin);
    }
    _begin = _end = end_array = nullptr;
  }